

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O1

void njoy::tools::disco::Integer<11u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
               (long *value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter)

{
  char cVar1;
  int iVar2;
  long i;
  long lVar3;
  ostringstream buffer;
  char local_1b8;
  undefined7 uStack_1b7;
  long local_1b0;
  long local_1a8 [2];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  lVar3 = *value;
  i = -lVar3;
  if (0 < lVar3) {
    i = lVar3;
  }
  iVar2 = Integer<11U>::minimumRequiredWidth<long>(i);
  lVar3 = *value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 0xb;
  if ((uint)(iVar2 - (int)(lVar3 >> 0x3f)) < 0xc) {
    std::ostream::_M_insert<long>((long)local_198);
  }
  else {
    lVar3 = *(long *)(local_198[0] + -0x18);
    if (acStack_b8[lVar3 + 1] == '\0') {
      cVar1 = std::ios::widen((char)&local_1b8 + (char)lVar3 + ' ');
      acStack_b8[lVar3] = cVar1;
      acStack_b8[lVar3 + 1] = '\x01';
    }
    acStack_b8[lVar3] = '*';
    local_1b8 = '*';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1b8,1);
  }
  std::__cxx11::stringbuf::str();
  if (local_1b0 != 0) {
    lVar3 = 0;
    do {
      std::__cxx11::string::push_back((char)iter->container);
      lVar3 = lVar3 + 1;
    } while (local_1b0 != lVar3);
  }
  if ((long *)CONCAT71(uStack_1b7,local_1b8) != local_1a8) {
    operator_delete((long *)CONCAT71(uStack_1b7,local_1b8),local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

static void write( const Representation& value, Iterator& iter ) {

    // std::abs does not exist for all integer types (e.g. unsigned)
    const Representation absValue = value < 0 ? -value : value;
    const auto required = minimumRequiredWidth( absValue )
                        + ( value < 0 ? 1 : 0 );

    std::ostringstream buffer;
    buffer << std::right << std::setw( Width );
    if ( required > Width ) {

      buffer << std::setfill( '*' ) << '*';
    }
    else {

      buffer << value;
    }

    for ( auto b : buffer.str() ) {

      *iter++ = b;
    }
  }